

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_IteratedLogicalExprPrecedence_Test::TestBody
          (ExprWriterTest_IteratedLogicalExprPrecedence_Test *this)

{
  ExprFactory *this_00;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> BVar1;
  ExprBase else_expr;
  NumericConstant then_expr;
  IteratedLogicalExpr IVar2;
  ExprBase EVar3;
  char *pcVar4;
  AssertHelper local_1a0;
  AssertionResult gtest_ar_2;
  string local_188;
  LogicalExpr args2 [2];
  LogicalExpr args [2];
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_148;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_118;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_e8;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_b8;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_88;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_58;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory;
  else_expr.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.0);
  then_expr = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,1.0);
  BVar1.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  args[0].super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,AND,BVar1,BVar1);
  args[1].super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  local_58.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.size_ = 2;
  local_58.data_ = args;
  IVar2 = ExprWriterTest::MakeIteratedLogical(&this->super_ExprWriterTest,FORALL,&local_58);
  EVar3.impl_ = else_expr.impl_;
  gtest_ar_2._0_8_ =
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  IVar2.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_188,(fmt *)0x14e4d3,(CStringRef)&gtest_ar_2,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar3.impl_);
  testing::internal::CmpHelperEQ<char[39],std::__cxx11::string>
            ((internal *)args2,"\"if /* forall */ ((0 && 0) && 0) then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeIteratedLogical(ex::FORALL, args), n1, n0)))"
             ,(char (*) [39])"if /* forall */ ((0 && 0) && 0) then 1",&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                   *)&local_58);
  if ((char)args2[0].super_ExprBase.impl_ == '\0') {
    testing::Message::Message((Message *)&local_188);
    if (args2[1].super_ExprBase.impl_ == (Impl *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)args2[1].super_ExprBase.impl_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2d3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_188);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(args2 + 1));
  BVar1.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  args[0].super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,BVar1,BVar1
                 );
  local_88.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.size_ = 2;
  local_88.data_ = args;
  IVar2 = ExprWriterTest::MakeIteratedLogical(&this->super_ExprWriterTest,EXISTS,&local_88);
  EVar3.impl_ = else_expr.impl_;
  gtest_ar_2._0_8_ =
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  IVar2.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_188,(fmt *)0x14e4d3,(CStringRef)&gtest_ar_2,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar3.impl_);
  testing::internal::CmpHelperEQ<char[39],std::__cxx11::string>
            ((internal *)args2,"\"if /* exists */ ((0 || 0) || 0) then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeIteratedLogical(ex::EXISTS, args), n1, n0)))"
             ,(char (*) [39])"if /* exists */ ((0 || 0) || 0) then 1",&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                   *)&local_88);
  if ((char)args2[0].super_ExprBase.impl_ == '\0') {
    testing::Message::Message((Message *)&local_188);
    if (args2[1].super_ExprBase.impl_ == (Impl *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)args2[1].super_ExprBase.impl_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2d6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_188);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(args2 + 1));
  args[0].super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  local_b8.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.size_ = 2;
  local_b8.data_ = args;
  args2[0].super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeIteratedLogical(&this->super_ExprWriterTest,FORALL,&local_b8);
  args2[1].super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                   *)&local_b8);
  local_e8.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.size_ = 2;
  local_e8.data_ = (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)args2;
  IVar2 = ExprWriterTest::MakeIteratedLogical(&this->super_ExprWriterTest,FORALL,&local_e8);
  EVar3.impl_ = else_expr.impl_;
  local_1a0.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  IVar2.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_188,(fmt *)0x14e4d3,(CStringRef)&local_1a0,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar3.impl_);
  testing::internal::CmpHelperEQ<char[52],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"if /* forall */ (/* forall */ (0 && 0) && 0) then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeIteratedLogical(ex::FORALL, args2), n1, n0)))"
             ,(char (*) [52])"if /* forall */ (/* forall */ (0 && 0) && 0) then 1",&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                   *)&local_e8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_188);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2da,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_188);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_118.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.size_ = 2;
  local_118.data_ = args;
  args2[0].super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeIteratedLogical(&this->super_ExprWriterTest,EXISTS,&local_118);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                   *)&local_118);
  local_148.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.size_ = 2;
  local_148.data_ = (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)args2;
  IVar2 = ExprWriterTest::MakeIteratedLogical(&this->super_ExprWriterTest,EXISTS,&local_148);
  local_1a0.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  IVar2.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_188,(fmt *)0x14e4d3,(CStringRef)&local_1a0,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)else_expr.impl_);
  testing::internal::CmpHelperEQ<char[52],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"if /* exists */ (/* exists */ (0 || 0) || 0) then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeIteratedLogical(ex::EXISTS, args2), n1, n0)))"
             ,(char (*) [52])"if /* exists */ (/* exists */ (0 || 0) || 0) then 1",&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                   *)&local_148);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_188);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2dd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_188);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, IteratedLogicalExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  LogicalExpr args[] = {MakeBinaryLogical(ex::AND, l0, l0), l0};
  CHECK_WRITE("if /* forall */ ((0 && 0) && 0) then 1",
      MakeIf(MakeIteratedLogical(ex::FORALL, args), n1, n0));
  args[0] = MakeBinaryLogical(ex::OR, l0, l0);
  CHECK_WRITE("if /* exists */ ((0 || 0) || 0) then 1",
      MakeIf(MakeIteratedLogical(ex::EXISTS, args), n1, n0));
  args[0] = l0;
  LogicalExpr args2[] = {MakeIteratedLogical(ex::FORALL, args), l0};
  CHECK_WRITE("if /* forall */ (/* forall */ (0 && 0) && 0) then 1",
      MakeIf(MakeIteratedLogical(ex::FORALL, args2), n1, n0));
  args2[0] = MakeIteratedLogical(ex::EXISTS, args);
  CHECK_WRITE("if /* exists */ (/* exists */ (0 || 0) || 0) then 1",
      MakeIf(MakeIteratedLogical(ex::EXISTS, args2), n1, n0));
}